

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MinefieldResponseNackPdu.cpp
# Opt level: O0

void __thiscall
DIS::MinefieldResponseNackPdu::marshal(MinefieldResponseNackPdu *this,DataStream *dataStream)

{
  char acVar1 [8];
  size_type sVar2;
  char acVar3 [8];
  const_reference pvVar4;
  undefined1 local_30 [8];
  EightByteChunk x;
  size_t idx;
  DataStream *dataStream_local;
  MinefieldResponseNackPdu *this_local;
  
  MinefieldFamilyPdu::marshal(&this->super_MinefieldFamilyPdu,dataStream);
  EntityID::marshal(&this->_minefieldID,dataStream);
  EntityID::marshal(&this->_requestingEntityID,dataStream);
  DataStream::operator<<(dataStream,this->_requestID);
  sVar2 = std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::size
                    (&this->_missingPduSequenceNumbers);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  x._otherParameters[0] = '\0';
  x._otherParameters[1] = '\0';
  x._otherParameters[2] = '\0';
  x._otherParameters[3] = '\0';
  x._otherParameters[4] = '\0';
  x._otherParameters[5] = '\0';
  x._otherParameters[6] = '\0';
  x._otherParameters[7] = '\0';
  while( true ) {
    acVar1 = x._otherParameters;
    acVar3 = (char  [8])
             std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::size
                       (&this->_missingPduSequenceNumbers);
    if ((ulong)acVar3 <= (ulong)acVar1) break;
    pvVar4 = std::vector<DIS::EightByteChunk,_std::allocator<DIS::EightByteChunk>_>::operator[]
                       (&this->_missingPduSequenceNumbers,(size_type)x._otherParameters);
    EightByteChunk::EightByteChunk((EightByteChunk *)local_30,pvVar4);
    EightByteChunk::marshal((EightByteChunk *)local_30,dataStream);
    EightByteChunk::~EightByteChunk((EightByteChunk *)local_30);
    x._otherParameters = (char  [8])((long)x._otherParameters + 1);
  }
  return;
}

Assistant:

void MinefieldResponseNackPdu::marshal(DataStream& dataStream) const
{
    MinefieldFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _minefieldID.marshal(dataStream);
    _requestingEntityID.marshal(dataStream);
    dataStream << _requestID;
    dataStream << ( unsigned char )_missingPduSequenceNumbers.size();

     for(size_t idx = 0; idx < _missingPduSequenceNumbers.size(); idx++)
     {
        EightByteChunk x = _missingPduSequenceNumbers[idx];
        x.marshal(dataStream);
     }

}